

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Abc_SclOneNodePrint(Bus_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  SC_Cell *p_00;
  char *pcVar3;
  float fVar4;
  float fVar5;
  uint local_2c;
  SC_Cell *pCell;
  Abc_Obj_t *pObj_local;
  Bus_Man_t *p_local;
  
  p_00 = Abc_SclObjCell(pObj);
  iVar1 = Abc_ObjFaninNum(pObj);
  pcVar3 = "Node";
  if (iVar1 == 0) {
    pcVar3 = " Inv";
  }
  uVar2 = Abc_ObjId(pObj);
  printf("%s%7d :  ",pcVar3,(ulong)uVar2);
  iVar1 = Abc_ObjFaninNum(pObj);
  if (iVar1 == 0) {
    local_2c = 1;
  }
  else {
    local_2c = Abc_ObjFaninNum(pObj);
  }
  uVar2 = Abc_ObjFanoutNum(pObj);
  printf("%d/%2d   ",(ulong)local_2c,(ulong)uVar2);
  printf("%12s ",p_00->pName);
  printf("(%2d/%2d)  ",(ulong)(uint)p_00->Order,(ulong)(uint)p_00->nGates);
  fVar4 = Bus_SclObjLoad(pObj);
  fVar5 = SC_CellPinCapAve(p_00);
  printf("gain =%5d  ",(ulong)(uint)(int)((fVar4 * 100.0) / fVar5));
  fVar4 = Bus_SclObjDept(pObj);
  printf("dept =%7.0f ps  ",(double)fVar4);
  printf("\n");
  return;
}

Assistant:

void Abc_SclOneNodePrint( Bus_Man_t * p, Abc_Obj_t * pObj )
{
    SC_Cell * pCell = Abc_SclObjCell(pObj);
    printf( "%s%7d :  ",        (Abc_ObjFaninNum(pObj) == 0) ? " Inv" : "Node", Abc_ObjId(pObj) );
    printf( "%d/%2d   ",        Abc_ObjFaninNum(pObj) ? Abc_ObjFaninNum(pObj) : 1, Abc_ObjFanoutNum(pObj) );
    printf( "%12s ",            pCell->pName );
    printf( "(%2d/%2d)  ",      pCell->Order, pCell->nGates );
    printf( "gain =%5d  ",      (int)(100.0 * Bus_SclObjLoad(pObj) / SC_CellPinCapAve(pCell)) );
    printf( "dept =%7.0f ps  ", Bus_SclObjDept(pObj) );
    printf( "\n" );
}